

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listhead.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int status;
  fitsfile *fptr;
  int nkeys;
  int hdupos;
  char card [81];
  int local_9c;
  fitsfile *local_98;
  int local_90;
  uint local_8c;
  char local_88 [88];
  
  local_9c = 0;
  if (argc == 2) {
    iVar2 = ffopentest(10,&local_98,argv[1],0,&local_9c);
    if (iVar2 == 0) {
      ffghdn(local_98,(int *)&local_8c);
      if ((local_8c == 1) && (pcVar4 = strchr(argv[1],0x5b), pcVar4 == (char *)0x0)) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      if (local_9c == 0) {
        do {
          ffghsp(local_98,&local_90,(int *)0x0,&local_9c);
          printf("Header listing for HDU #%d:\n",(ulong)local_8c);
          if (0 < local_90) {
            iVar2 = 0;
            do {
              iVar2 = iVar2 + 1;
              iVar3 = ffgrec(local_98,iVar2,local_88,&local_9c);
              if (iVar3 != 0) break;
              puts(local_88);
            } while (iVar2 < local_90);
          }
          puts("END\n");
          if (!bVar1) break;
          ffmrhd(local_98,1,(int *)0x0,&local_9c);
          local_8c = local_8c + 1;
        } while (local_9c == 0);
      }
      if (local_9c == 0x6b) {
        local_9c = 0;
      }
      ffclos(local_98,&local_9c);
    }
    iVar2 = 0;
    if (local_9c != 0) {
      ffrprt(_stderr,local_9c);
      iVar2 = local_9c;
    }
  }
  else {
    puts("Usage:  listhead filename[ext] ");
    putchar(10);
    puts("List the FITS header keywords in a single extension, or, if ");
    puts("ext is not given, list the keywords in all the extensions. ");
    putchar(10);
    puts("Examples: ");
    puts("   listhead file.fits      - list every header in the file ");
    puts("   listhead file.fits[0]   - list primary array header ");
    puts("   listhead file.fits[2]   - list header of 2nd extension ");
    puts("   listhead file.fits+2    - same as above ");
    puts("   listhead file.fits[GTI] - list header of GTI extension");
    putchar(10);
    puts("Note that it may be necessary to enclose the input file");
    puts("name in single quote characters on the Unix command line.");
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
    fitsfile *fptr;         /* FITS file pointer, defined in fitsio.h */
    char card[FLEN_CARD];   /* Standard string lengths defined in fitsio.h */
    int status = 0, single = 0, hdupos, nkeys, ii;

    if (argc != 2) {
      printf("Usage:  listhead filename[ext] \n");
      printf("\n");
      printf("List the FITS header keywords in a single extension, or, if \n");
      printf("ext is not given, list the keywords in all the extensions. \n");
      printf("\n");
      printf("Examples: \n");
      printf("   listhead file.fits      - list every header in the file \n");
      printf("   listhead file.fits[0]   - list primary array header \n");
      printf("   listhead file.fits[2]   - list header of 2nd extension \n");
      printf("   listhead file.fits+2    - same as above \n");
      printf("   listhead file.fits[GTI] - list header of GTI extension\n");
      printf("\n");
      printf("Note that it may be necessary to enclose the input file\n");
      printf("name in single quote characters on the Unix command line.\n");
      return(0);
    }

    if (!fits_open_file(&fptr, argv[1], READONLY, &status))
    {
      fits_get_hdu_num(fptr, &hdupos);  /* Get the current HDU position */

      /* List only a single header if a specific extension was given */ 
      if (hdupos != 1 || strchr(argv[1], '[')) single = 1;

      for (; !status; hdupos++)  /* Main loop through each extension */
      {
        fits_get_hdrspace(fptr, &nkeys, NULL, &status); /* get # of keywords */

        printf("Header listing for HDU #%d:\n", hdupos);

        for (ii = 1; ii <= nkeys; ii++) { /* Read and print each keywords */

           if (fits_read_record(fptr, ii, card, &status))break;
           printf("%s\n", card);
        }
        printf("END\n\n");  /* terminate listing with END */

        if (single) break;  /* quit if only listing a single header */

        fits_movrel_hdu(fptr, 1, NULL, &status);  /* try to move to next HDU */
      }

      if (status == END_OF_FILE)  status = 0; /* Reset after normal error */

      fits_close_file(fptr, &status);
    }

    if (status) fits_report_error(stderr, status); /* print any error message */
    return(status);
}